

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_BlindUnmatchInOutTest_Test::TestBody
          (ConfidentialTransaction_BlindUnmatchInOutTest_Test *this)

{
  char *message;
  Amount AVar1;
  AssertHelper local_2c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  AssertionResult gtest_ar;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> blind_list;
  Pubkey pubkey2;
  Pubkey pubkey1;
  string privkey2_hex;
  string pubkey2_hex;
  string privkey1_hex;
  string pubkey1_hex;
  string inputassetblinder;
  string inputasset;
  string inputblinder;
  string tx_hex;
  BlindParameter param;
  Privkey privkey2;
  Privkey privkey1;
  ConfidentialTransaction tx;
  
  std::__cxx11::string::string
            ((string *)&tx_hex,
             "020000000001e6162f9bbac022e67327e717a3885b316a54e50c34ba266b58f1999854c596810100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000138800017a914a3949e9a8b0b813db67c8fc5ad14194a297979cd870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000027100017a9145227b0820cf08f489873888672a5d97face863b2870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000"
             ,(allocator *)&param);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,&tx_hex);
  std::__cxx11::string::string
            ((string *)&inputblinder,
             "55bf185ddc2d1c747da2a82b8c9954179edec0af886daaf98d8a7b862e78bcee",(allocator *)&param)
  ;
  std::__cxx11::string::string
            ((string *)&inputasset,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",(allocator *)&param)
  ;
  std::__cxx11::string::string
            ((string *)&inputassetblinder,
             "95e6e0912047f088394be103f3a1761adcbd92466abfe41f0964a3aa2fc201e5",(allocator *)&param)
  ;
  std::__cxx11::string::string
            ((string *)&pubkey1_hex,
             "0213c4451645063e1edd5fe76e5194864c2246d4c4e6c8df5a305224046e1ea2c4",
             (allocator *)&param);
  std::__cxx11::string::string
            ((string *)&privkey1_hex,
             "66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83",(allocator *)&param)
  ;
  std::__cxx11::string::string
            ((string *)&pubkey2_hex,
             "0222722d38de0463756bdfc460de0547a89e17159150d07b6cf69029ba33adf967",
             (allocator *)&param);
  std::__cxx11::string::string
            ((string *)&privkey2_hex,
             "715b3d80726388b7daff92388f82c8ddf5ee7248900552a0bcd16d7d46b439c0",(allocator *)&param)
  ;
  cfd::core::Pubkey::Pubkey(&pubkey1,&pubkey1_hex);
  cfd::core::Privkey::Privkey(&privkey1,&privkey1_hex,kMainnet,true);
  cfd::core::Pubkey::Pubkey(&pubkey2,&pubkey2_hex);
  cfd::core::Privkey::Privkey(&privkey2,&privkey2_hex,kMainnet,true);
  blind_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blind_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blind_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::UnblindParameter::UnblindParameter(&param);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&pubkeys,&inputasset);
  cfd::core::ConfidentialAssetId::operator=(&param.asset,(ConfidentialAssetId *)&pubkeys);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&pubkeys);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&pubkeys,&inputassetblinder);
  cfd::core::BlindFactor::operator=(&param.abf,(BlindFactor *)&pubkeys);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&pubkeys);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)&pubkeys,&inputblinder);
  cfd::core::BlindFactor::operator=(&param.vbf,(BlindFactor *)&pubkeys);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&pubkeys);
  AVar1 = cfd::core::Amount::CreateByCoinAmount(0.003);
  gtest_ar._0_8_ = AVar1.amount_;
  gtest_ar.message_.ptr_._0_1_ = AVar1.ignore_check_;
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&pubkeys,(Amount *)&gtest_ar)
  ;
  cfd::core::ConfidentialValue::operator=(&param.value,(ConfidentialValue *)&pubkeys);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&pubkeys);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::push_back
            (&blind_list,&param);
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back(&pubkeys,&pubkey1);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back(&pubkeys,&pubkey2);
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_ar);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
  emplace_back<cfd::core::Pubkey>(&pubkeys,(Pubkey *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  cfd::core::ConfidentialTransaction::BlindTxOut
            (&tx,&blind_list,&pubkeys,1,0,0x34,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
  message = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"\"","\"Error Test Fail.\"","","Error Test Fail.");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2b8);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      message = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x466,message);
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
  cfd::core::UnblindParameter::~UnblindParameter(&param);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            (&blind_list);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey1);
  std::__cxx11::string::~string((string *)&privkey2_hex);
  std::__cxx11::string::~string((string *)&pubkey2_hex);
  std::__cxx11::string::~string((string *)&privkey1_hex);
  std::__cxx11::string::~string((string *)&pubkey1_hex);
  std::__cxx11::string::~string((string *)&inputassetblinder);
  std::__cxx11::string::~string((string *)&inputasset);
  std::__cxx11::string::~string((string *)&inputblinder);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  std::__cxx11::string::~string((string *)&tx_hex);
  return;
}

Assistant:

TEST(ConfidentialTransaction, BlindUnmatchInOutTest) {
  std::string tx_hex = "020000000001e6162f9bbac022e67327e717a3885b316a54e50c34ba266b58f1999854c596810100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000138800017a914a3949e9a8b0b813db67c8fc5ad14194a297979cd870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000027100017a9145227b0820cf08f489873888672a5d97face863b2870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000";
  ConfidentialTransaction tx(tx_hex);
  double inputamount = 0.003;
  std::string inputblinder =
      "55bf185ddc2d1c747da2a82b8c9954179edec0af886daaf98d8a7b862e78bcee";
  std::string inputasset =
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225";
  std::string inputassetblinder =
      "95e6e0912047f088394be103f3a1761adcbd92466abfe41f0964a3aa2fc201e5";
  std::string pubkey1_hex =
      "0213c4451645063e1edd5fe76e5194864c2246d4c4e6c8df5a305224046e1ea2c4";
  std::string privkey1_hex =
      "66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83";
  std::string pubkey2_hex =
      "0222722d38de0463756bdfc460de0547a89e17159150d07b6cf69029ba33adf967";
  std::string privkey2_hex =
      "715b3d80726388b7daff92388f82c8ddf5ee7248900552a0bcd16d7d46b439c0";
  Pubkey pubkey1(pubkey1_hex);
  Privkey privkey1(privkey1_hex);
  Pubkey pubkey2(pubkey2_hex);
  Privkey privkey2(privkey2_hex);

  std::vector<BlindParameter> blind_list;
  BlindParameter param;
  param.asset = ConfidentialAssetId(inputasset);
  param.abf = BlindFactor(inputassetblinder);
  param.vbf = BlindFactor(inputblinder);
  param.value = ConfidentialValue(Amount::CreateByCoinAmount(inputamount));
  blind_list.push_back(param);
  std::vector<Pubkey> pubkeys;
  pubkeys.push_back(pubkey1);
  pubkeys.push_back(pubkey2);
  pubkeys.push_back(Pubkey());

  try {
    tx.BlindTxOut(blind_list, pubkeys);
  } catch (const CfdException& except) {
    EXPECT_STREQ("unmatch input/output amount.", except.what());
    return;
  }
  EXPECT_STREQ("", "Error Test Fail.");
}